

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
USBSimulationDataGenerator::Initialize
          (USBSimulationDataGenerator *this,U32 simulation_sample_rate,USBAnalyzerSettings *settings
          )

{
  SimulationChannelDescriptor *pSVar1;
  USBAnalyzerSettings *settings_local;
  U32 simulation_sample_rate_local;
  USBSimulationDataGenerator *this_local;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  if (this->mSettings->mSpeed == LOW_SPEED) {
    this->mpCurrSimData = SimDataLS;
  }
  else {
    this->mpCurrSimData = SimDataFS;
  }
  this->mAccuDur = 0.0;
  this->mFrameCnt = 1;
  ClockGenerator::Init((double)(simulation_sample_rate / 10),(int)this + 0x10);
  pSVar1 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)&this->mUSBSimulationChannels,(int)settings + 0x10,
                      this->mSimulationSampleRateHz);
  this->mDP = pSVar1;
  pSVar1 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)&this->mUSBSimulationChannels,(int)settings + 0x20,
                      this->mSimulationSampleRateHz);
  this->mDM = pSVar1;
  ClockGenerator::AdvanceByTimeS(0.001);
  SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  return;
}

Assistant:

void USBSimulationDataGenerator::Initialize( U32 simulation_sample_rate, USBAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    if( mSettings->mSpeed == LOW_SPEED )
        mpCurrSimData = SimDataLS;
    else
        mpCurrSimData = SimDataFS;

    mAccuDur = 0;
    mFrameCnt = 1;

    mClockGenerator.Init( simulation_sample_rate / 10, simulation_sample_rate );

    mDP = mUSBSimulationChannels.Add( settings->mDPChannel, mSimulationSampleRateHz, BIT_LOW );
    mDM = mUSBSimulationChannels.Add( settings->mDMChannel, mSimulationSampleRateHz, BIT_LOW );

    mUSBSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( .001 ) ); // insert a pause before we start
}